

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefileCall::cmMakefileCall
          (cmMakefileCall *this,cmMakefile *mf,cmCommandContext *cc,cmExecutionStatus *status)

{
  int *piVar1;
  cmMakefile *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var3;
  size_type sVar4;
  string local_88;
  cmListFileContext local_68;
  
  this->Makefile = mf;
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_88,&mf->StateSnapshot);
  cmListFileContext::FromCommandContext(&local_68,cc,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  cmListFileBacktrace::Push
            ((cmListFileBacktrace *)&local_88,(cmListFileContext *)&this->Makefile->Backtrace);
  sVar4 = local_88._M_string_length;
  _Var3._M_p = local_88._M_dataplus._M_p;
  pcVar2 = this->Makefile;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  this_00 = (pcVar2->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pcVar2->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_p;
  (pcVar2->Backtrace).TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
    }
  }
  pcVar2 = this->Makefile;
  piVar1 = &pcVar2->RecursionDepth;
  *piVar1 = *piVar1 + 1;
  local_88._M_dataplus._M_p = &status->ReturnInvoked;
  std::vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>>::
  emplace_back<cmExecutionStatus*>
            ((vector<cmExecutionStatus*,std::allocator<cmExecutionStatus*>> *)
             &pcVar2->ExecutionStatusStack,(cmExecutionStatus **)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.FilePath._M_dataplus._M_p != &local_68.FilePath.field_2) {
    operator_delete(local_68.FilePath._M_dataplus._M_p,
                    local_68.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.Name._M_dataplus._M_p != &local_68.Name.field_2) {
    operator_delete(local_68.Name._M_dataplus._M_p,local_68.Name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmMakefileCall(cmMakefile* mf, cmCommandContext const& cc,
                 cmExecutionStatus& status)
    : Makefile(mf)
  {
    cmListFileContext const& lfc = cmListFileContext::FromCommandContext(
      cc, this->Makefile->StateSnapshot.GetExecutionListFile());
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(lfc);
    ++this->Makefile->RecursionDepth;
    this->Makefile->ExecutionStatusStack.push_back(&status);
  }